

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * __thiscall
fmt::v6::internal::float_writer<wchar_t>::prettify<wchar_t*>
          (float_writer<wchar_t> *this,wchar_t *it)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  wchar_t *pwVar5;
  wchar_t *pwVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  
  uVar12 = this->num_digits_;
  uVar7 = this->exp_ + uVar12;
  uVar9 = (ulong)uVar7;
  if ((this->specs_).field_0x4 == '\x01') {
    pcVar2 = this->digits_;
    *it = (int)*pcVar2;
    iVar11 = (this->specs_).precision - uVar12;
    if (((int)uVar12 < 2) && (((this->specs_).field_0x6 & 0x20) == 0)) {
      pwVar6 = it + 1;
    }
    else {
      it[1] = this->decimal_point_;
      pwVar6 = it + 2;
    }
    pwVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,wchar_t*>(pcVar2 + 1,pcVar2 + (int)uVar12,pwVar6);
    uVar12 = *(uint *)&(this->specs_).field_0x4;
    if ((uVar12 >> 0x15 & 1) != 0 && 0 < iVar11) {
      pwVar6 = std::__fill_n_a<wchar_t*,int,wchar_t>(pwVar6,iVar11);
      uVar12 = *(uint *)&(this->specs_).field_0x4;
    }
    *pwVar6 = (uint)((uVar12 >> 0x10 & 1) == 0) << 5 | 0x45;
    pwVar6 = write_exponent<wchar_t,wchar_t*>(uVar7 - 1,pwVar6 + 1);
    return pwVar6;
  }
  if (this->exp_ < 0) {
    if ((int)uVar7 < 1) {
      *it = L'0';
      iVar11 = -uVar7;
      if (uVar12 == 0) {
        iVar1 = (this->specs_).precision;
        iVar4 = iVar11;
        if (SBORROW4(iVar1,iVar11) != (int)(iVar1 + uVar7) < 0) {
          iVar4 = iVar1;
        }
        if (-1 < iVar1) {
          iVar11 = iVar4;
        }
      }
      uVar7 = *(uint *)&(this->specs_).field_0x4 & 0x200000;
      if (0 < (int)uVar12 && (char)(uVar7 >> 0x15) == '\0') {
        do {
          if (this->digits_[(ulong)uVar12 - 1] != '0') goto LAB_001640d8;
          bVar3 = 1 < (int)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar3);
        uVar12 = 0;
      }
LAB_001640d8:
      if ((uVar7 != 0 || iVar11 != 0) || uVar12 != 0) {
        it[1] = this->decimal_point_;
        pwVar6 = std::__fill_n_a<wchar_t*,int,wchar_t>(it + 2,iVar11);
        pwVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                 __copy_m<char_const*,wchar_t*>(this->digits_,this->digits_ + (int)uVar12,pwVar6);
        return pwVar6;
      }
      return it + 1;
    }
    pwVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,wchar_t*>(this->digits_,this->digits_ + uVar9,it);
    if (((this->specs_).field_0x6 & 0x20) == 0) {
      uVar12 = this->num_digits_;
      lVar10 = (long)(int)uVar12;
      pcVar2 = this->digits_;
      uVar8 = uVar9;
      if ((int)uVar12 < (int)uVar7) {
        uVar8 = (ulong)uVar12;
      }
      do {
        uVar12 = (uint)uVar8;
        if (lVar10 <= (long)uVar9) {
LAB_0016415c:
          if (uVar12 != uVar7) {
            *pwVar6 = this->decimal_point_;
            pwVar6 = pwVar6 + 1;
          }
          pwVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char_const*,wchar_t*>(pcVar2 + uVar9,pcVar2 + (int)uVar12,pwVar6);
          return pwVar6;
        }
        if (pcVar2[lVar10 + -1] != '0') {
          uVar12 = (uint)lVar10;
          goto LAB_0016415c;
        }
        lVar10 = lVar10 + -1;
      } while( true );
    }
    *pwVar6 = this->decimal_point_;
    pwVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,wchar_t*>
                       (this->digits_ + uVar9,this->digits_ + this->num_digits_,pwVar6 + 1);
    if ((this->specs_).precision <= this->num_digits_) {
      return pwVar6;
    }
  }
  else {
    pwVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,wchar_t*>(this->digits_,this->digits_ + (int)uVar12,it);
    pwVar5 = std::__fill_n_a<wchar_t*,int,wchar_t>(pwVar6,uVar7 - this->num_digits_);
    iVar11 = (this->specs_).precision;
    if ((byte)(iVar11 < 0 | ((this->specs_).field_0x6 & 0x20) >> 5) != 1) {
      return pwVar5;
    }
    pwVar6 = pwVar5 + 1;
    *pwVar5 = this->decimal_point_;
    if (iVar11 <= (int)uVar7) {
      if ((this->specs_).field_0x4 == '\x02') {
        return pwVar6;
      }
      pwVar5[1] = L'0';
      return pwVar5 + 2;
    }
  }
  pwVar6 = std::__fill_n_a<wchar_t*,int,wchar_t>(pwVar6);
  return pwVar6;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }